

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_models.c
# Opt level: O1

void s390_init_cpu_model(uc_struct *uc,uc_cpu_s390x cpu_model)

{
  CPUState *pCVar1;
  CPUClass *pCVar2;
  unsigned_long uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  long lVar9;
  TranslationBlock *pTVar10;
  TranslationBlock *pTVar11;
  S390CPUClass *xcc;
  S390CPU *cpu;
  undefined4 uVar12;
  undefined4 uVar13;
  uint32_t uVar14;
  undefined4 uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  
  lVar9 = 0;
  do {
    ignored_base_feat[(ulong)(long)*(int *)((long)&init_ignored_base_feat_feats + lVar9) >> 6] =
         ignored_base_feat[(ulong)(long)*(int *)((long)&init_ignored_base_feat_feats + lVar9) >> 6]
         | 1L << ((byte)*(int *)((long)&init_ignored_base_feat_feats + lVar9) & 0x3f);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x30);
  s390_init_feat_bitmap(qemu_max_cpu_feat_init,qemu_max_cpu_feat);
  lVar9 = 0;
  do {
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].base_init + lVar9),
               (unsigned_long *)((long)s390_cpu_defs[0].base_feat + lVar9));
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].default_init + lVar9),
               (unsigned_long *)((long)s390_cpu_defs[0].default_feat + lVar9));
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].full_init + lVar9),
               (unsigned_long *)((long)s390_cpu_defs[0].full_feat + lVar9));
    lVar9 = lVar9 + 0x110;
  } while (lVar9 != 0x2640);
  s390_set_qemu_cpu_model(0x2964,'\r','\x02',s390_init_cpu_model::qemu_latest_init);
  if (cpu_model < UC_CPU_S390X_QEMU) {
    pCVar1 = uc->cpu;
    pCVar2 = pCVar1->cc;
    pCVar2[1].reset = (_func_void_CPUState_ptr_conflict *)(s390_cpu_defs + cpu_model);
    *(undefined1 *)&pCVar2[1].has_work = 1;
    pTVar10 = (TranslationBlock *)g_malloc0(0x40);
    pCVar1[1].tb_jmp_cache[0x1db] = pTVar10;
    pTVar11 = pCVar1[1].tb_jmp_cache[0x1f1];
    pTVar10->pc = (target_ulong)pTVar11;
    if (*(char *)(pCVar1[1].tb_jmp_cache + 0x1f2) == '\x01') {
      (pTVar10->tc).size = pTVar11->page_next[1];
      uVar12 = *(undefined4 *)&(pTVar11->tc).ptr;
      uVar13 = *(undefined4 *)((long)&(pTVar11->tc).ptr + 4);
      uVar14 = (uint32_t)(pTVar11->tc).size;
      uVar15 = *(undefined4 *)((long)&(pTVar11->tc).size + 4);
      uVar16 = *(uint32_t *)&pTVar11->orig_tb;
      uVar17 = *(uint32_t *)((long)&pTVar11->orig_tb + 4);
      uVar18 = (undefined4)pTVar11->page_next[0];
      uVar19 = *(undefined4 *)((long)pTVar11->page_next + 4);
    }
    else {
      (pTVar10->tc).size = pTVar11->jmp_dest[1];
      uVar12 = (undefined4)pTVar11->jmp_list_head;
      uVar13 = *(undefined4 *)((long)&pTVar11->jmp_list_head + 4);
      uVar14 = (uint32_t)pTVar11->jmp_list_next[0];
      uVar15 = *(undefined4 *)((long)pTVar11->jmp_list_next + 4);
      uVar16 = (uint32_t)pTVar11->jmp_list_next[1];
      uVar17 = *(uint32_t *)((long)pTVar11->jmp_list_next + 0xc);
      uVar18 = (undefined4)pTVar11->jmp_dest[0];
      uVar19 = *(undefined4 *)((long)pTVar11->jmp_dest + 4);
    }
    pTVar10->cflags = uVar16;
    pTVar10->trace_vcpu_dstate = uVar17;
    *(undefined4 *)&(pTVar10->tc).ptr = uVar18;
    *(undefined4 *)((long)&(pTVar10->tc).ptr + 4) = uVar19;
    *(undefined4 *)&pTVar10->cs_base = uVar12;
    *(undefined4 *)((long)&pTVar10->cs_base + 4) = uVar13;
    pTVar10->flags = uVar14;
    pTVar10->size = (short)uVar15;
    pTVar10->icount = (short)((uint)uVar15 >> 0x10);
  }
  else {
    if (cpu_model == UC_CPU_S390X_QEMU) {
      pCVar1 = uc->cpu;
      pTVar11 = (TranslationBlock *)g_malloc0(0x40);
      pCVar1[1].tb_jmp_cache[0x1db] = pTVar11;
      uVar3 = s390_qemu_cpu_model.features[0];
      pTVar11->pc = (target_ulong)s390_qemu_cpu_model.def;
      pTVar11->cs_base = uVar3;
      uVar3 = s390_qemu_cpu_model.features[2];
      uVar4 = s390_qemu_cpu_model.features[1]._4_2_;
      uVar5 = s390_qemu_cpu_model.features[1]._6_2_;
      pTVar11->flags = (undefined4)s390_qemu_cpu_model.features[1];
      uVar7 = s390_qemu_cpu_model.features[2];
      pTVar11->size = uVar4;
      pTVar11->icount = uVar5;
      s390_qemu_cpu_model.features[2]._0_4_ = (undefined4)uVar3;
      s390_qemu_cpu_model.features[2]._4_4_ = SUB84(uVar3,4);
      uVar12 = s390_qemu_cpu_model.features[2]._4_4_;
      pTVar11->cflags = (undefined4)s390_qemu_cpu_model.features[2];
      s390_qemu_cpu_model.features[2] = uVar7;
      uVar3 = s390_qemu_cpu_model.features[4];
      pTVar11->trace_vcpu_dstate = uVar12;
      (pTVar11->tc).ptr = (void *)s390_qemu_cpu_model.features[3];
      (pTVar11->tc).size = uVar3;
      uVar12 = s390_qemu_cpu_model._48_4_;
      uVar14 = s390_qemu_cpu_model.cpu_id;
      uVar13 = s390_qemu_cpu_model._56_4_;
      uVar15 = s390_qemu_cpu_model._60_4_;
    }
    else {
      if (cpu_model != UC_CPU_S390X_MAX) {
        return;
      }
      pCVar1 = uc->cpu;
      if (get_max_cpu_model_cached == '\0') {
        get_max_cpu_model_max_model._0_8_ =
             s390_find_cpu_def(0x2964,'\r','\x02',(unsigned_long *)0x0);
        get_max_cpu_model_max_model._8_8_ = qemu_max_cpu_feat[0];
        get_max_cpu_model_max_model._16_8_ = qemu_max_cpu_feat[1];
        get_max_cpu_model_max_model._24_8_ = qemu_max_cpu_feat[2];
        get_max_cpu_model_max_model._32_8_ = qemu_max_cpu_feat[3];
        get_max_cpu_model_max_model._40_8_ = qemu_max_cpu_feat[4];
        get_max_cpu_model_cached = '\x01';
      }
      pTVar11 = (TranslationBlock *)g_malloc(0x40);
      pCVar1[1].tb_jmp_cache[0x1db] = pTVar11;
      uVar6 = get_max_cpu_model_max_model._8_8_;
      pTVar11->pc = get_max_cpu_model_max_model._0_8_;
      pTVar11->cs_base = uVar6;
      uVar6 = get_max_cpu_model_max_model._24_8_;
      uVar4 = get_max_cpu_model_max_model._20_2_;
      uVar5 = get_max_cpu_model_max_model._22_2_;
      pTVar11->flags = get_max_cpu_model_max_model._16_4_;
      uVar8 = get_max_cpu_model_max_model._24_8_;
      pTVar11->size = uVar4;
      pTVar11->icount = uVar5;
      get_max_cpu_model_max_model._24_4_ = (undefined4)uVar6;
      get_max_cpu_model_max_model._28_4_ = SUB84(uVar6,4);
      uVar12 = get_max_cpu_model_max_model._28_4_;
      pTVar11->cflags = get_max_cpu_model_max_model._24_4_;
      get_max_cpu_model_max_model._24_8_ = uVar8;
      uVar6 = get_max_cpu_model_max_model._40_8_;
      pTVar11->trace_vcpu_dstate = uVar12;
      (pTVar11->tc).ptr = (void *)get_max_cpu_model_max_model._32_8_;
      (pTVar11->tc).size = uVar6;
      uVar12 = get_max_cpu_model_max_model._48_4_;
      uVar14 = get_max_cpu_model_max_model._52_4_;
      uVar13 = get_max_cpu_model_max_model._56_4_;
      uVar15 = get_max_cpu_model_max_model._60_4_;
    }
    *(undefined4 *)&pTVar11->orig_tb = uVar12;
    *(uint32_t *)((long)&pTVar11->orig_tb + 4) = uVar14;
    *(undefined4 *)pTVar11->page_next = uVar13;
    *(undefined4 *)((long)pTVar11->page_next + 4) = uVar15;
  }
  return;
}

Assistant:

void s390_init_cpu_model(uc_engine *uc, uc_cpu_s390x cpu_model)
{
    static const S390FeatInit qemu_latest_init = { S390_FEAT_LIST_QEMU_LATEST };
    int i;

    init_ignored_base_feat();

    /* init all bitmaps from gnerated data initially */
    s390_init_feat_bitmap(qemu_max_cpu_feat_init, qemu_max_cpu_feat);
    for (i = 0; i < ARRAY_SIZE(s390_cpu_defs); i++) {
        s390_init_feat_bitmap(s390_cpu_defs[i].base_init,
                              s390_cpu_defs[i].base_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].default_init,
                              s390_cpu_defs[i].default_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].full_init,
                              s390_cpu_defs[i].full_feat);
    }

    /* initialize the qemu model with latest definition */
    s390_set_qemu_cpu_model(QEMU_MAX_CPU_TYPE, QEMU_MAX_CPU_GEN,
                            QEMU_MAX_CPU_EC_GA, qemu_latest_init);

    if (cpu_model < ARRAY_SIZE(s390_cpu_defs)) {
        s390_base_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_MAX) {
        s390_max_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_max_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_QEMU) {
        s390_qemu_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_qemu_cpu_model_initfn(uc->cpu);
    }

}